

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

void __thiscall
t_py_generator::generate_python_docstring
          (t_py_generator *this,ostream *out,t_doc *tdoc,t_struct *tstruct,char *subheader)

{
  t_field *ptVar1;
  string *psVar2;
  size_t sVar3;
  string *psVar4;
  pointer pptVar5;
  pointer *ppptVar6;
  stringstream ss;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (tdoc->has_doc_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(tdoc->doc_)._M_dataplus._M_p,(tdoc->doc_)._M_string_length);
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      goto LAB_00323994;
    }
  }
  else {
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00323b43;
LAB_00323994:
    ppptVar6 = &(tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (subheader == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(subheader);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,subheader,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":\n",2);
    pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar5 != *ppptVar6) {
      do {
        ptVar1 = *pptVar5;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," - ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(ptVar1->name_)._M_dataplus._M_p,
                   (ptVar1->name_)._M_string_length);
        psVar2 = &::endl_abi_cxx11_;
        psVar4 = &::endl_abi_cxx11_;
        if ((ptVar1->super_t_doc).has_doc_ == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
          psVar4 = &(ptVar1->super_t_doc).doc_;
          psVar2 = &(ptVar1->super_t_doc).doc_;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar2->_M_string_length);
        pptVar5 = pptVar5 + 1;
      } while (pptVar5 != *ppptVar6);
    }
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"\"\"\"\n","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  std::__cxx11::stringbuf::str();
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"\"\"\"\n","");
  t_generator::generate_docstring_comment
            (&this->super_t_generator,out,&local_1f8,&local_218,&local_1d8,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
LAB_00323b43:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void t_py_generator::generate_python_docstring(ostream& out,
                                               t_doc* tdoc,
                                               t_struct* tstruct,
                                               const char* subheader) {
  bool has_doc = false;
  stringstream ss;
  if (tdoc->has_doc()) {
    has_doc = true;
    ss << tdoc->get_doc();
  }

  const vector<t_field*>& fields = tstruct->get_members();
  if (fields.size() > 0) {
    if (has_doc) {
      ss << endl;
    }
    has_doc = true;
    ss << subheader << ":\n";
    vector<t_field*>::const_iterator p_iter;
    for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter) {
      t_field* p = *p_iter;
      ss << " - " << p->get_name();
      if (p->has_doc()) {
        ss << ": " << p->get_doc();
      } else {
        ss << endl;
      }
    }
  }

  if (has_doc) {
    generate_docstring_comment(out, "\"\"\"\n", "", ss.str(), "\"\"\"\n");
  }
}